

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

void llvm::report_fatal_error(Error *Err,bool GenCrashDiag)

{
  ErrorInfoBase *pEVar1;
  Twine ErrorBanner;
  ulong uVar2;
  undefined1 local_80 [8];
  string ErrMsg;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  raw_string_ostream ErrStream;
  
  pEVar1 = Err->Payload;
  uVar2 = (ulong)pEVar1 & 0xfffffffffffffffe;
  Err->Payload = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
  if (uVar2 != 0) {
    local_80 = (undefined1  [8])&ErrMsg._M_string_length;
    ErrMsg._M_dataplus._M_p = (pointer)0x0;
    ErrMsg._M_string_length._0_1_ = 0;
    ErrStream.super_raw_ostream.OutBufCur._0_4_ = 1;
    ErrStream.super_raw_ostream.OutBufEnd = (char *)0x0;
    ErrStream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
    ErrStream.super_raw_ostream.OutBufStart = (char *)0x0;
    local_48 = (undefined1  [8])&PTR__raw_string_ostream_01129208;
    ErrStream.super_raw_ostream._32_8_ = local_80;
    ErrStream.OS = (string *)((ulong)pEVar1 | 1);
    Err->Payload = (ErrorInfoBase *)0x0;
    Twine::Twine((Twine *)((long)&ErrMsg.field_2 + 8));
    ErrorBanner.RHS = (Child)uStack_58;
    ErrorBanner.LHS = (Child)ErrMsg.field_2._8_8_;
    ErrorBanner._16_8_ = local_50;
    logAllUnhandledErrors((Error *)&ErrStream.OS,(raw_ostream *)local_48,ErrorBanner);
    if ((long *)((ulong)ErrStream.OS & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)ErrStream.OS & 0xfffffffffffffffe) + 8))();
    }
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_48);
    report_fatal_error((string *)local_80,true);
  }
  __assert_fail("Err && \"report_fatal_error called with success value\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Error.cpp"
                ,0x8b,"void llvm::report_fatal_error(Error, bool)");
}

Assistant:

void report_fatal_error(Error Err, bool GenCrashDiag) {
  assert(Err && "report_fatal_error called with success value");
  std::string ErrMsg;
  {
    raw_string_ostream ErrStream(ErrMsg);
    logAllUnhandledErrors(std::move(Err), ErrStream);
  }
  report_fatal_error(ErrMsg);
}